

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O0

void __thiscall icu_63::RBBIRuleBuilder::optimizeTables(RBBIRuleBuilder *this)

{
  IntPair categories;
  bool bVar1;
  int32_t iVar2;
  int local_24 [2];
  pair<int,_int> local_1c;
  IntPair duplPair;
  bool didSomething;
  RBBIRuleBuilder *this_local;
  
  unique0x100000cc = this;
  do {
    duplPair.first._3_1_ = 0;
    local_24[1] = 3;
    local_24[0] = 0;
    std::pair<int,_int>::pair<int,_int,_true>(&local_1c,local_24 + 1,local_24);
    while (bVar1 = RBBITableBuilder::findDuplCharClassFrom(this->fForwardTable,&local_1c), bVar1) {
      categories.second = local_1c.second;
      categories.first = local_1c.first;
      RBBISetBuilder::mergeCategories(this->fSetBuilder,categories);
      RBBITableBuilder::removeColumn(this->fForwardTable,local_1c.second);
      duplPair.first._3_1_ = 1;
    }
    while (iVar2 = RBBITableBuilder::removeDuplicateStates(this->fForwardTable), 0 < iVar2) {
      duplPair.first._3_1_ = 1;
    }
  } while ((duplPair.first._3_1_ & 1) != 0);
  return;
}

Assistant:

void RBBIRuleBuilder::optimizeTables() {
    bool didSomething;
    do {
        didSomething = false;

        // Begin looking for duplicates with char class 3.
        // Classes 0, 1 and 2 are special; they are unused, {bof} and {eof} respectively,
        // and should not have other categories merged into them.
        IntPair duplPair = {3, 0};
        while (fForwardTable->findDuplCharClassFrom(&duplPair)) {
            fSetBuilder->mergeCategories(duplPair);
            fForwardTable->removeColumn(duplPair.second);
            didSomething = true;
        }

        while (fForwardTable->removeDuplicateStates() > 0) {
            didSomething = true;
        }
    } while (didSomething);
}